

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# well.hpp
# Opt level: O2

result_type __thiscall
Well<unsigned_int,_32UL,_624UL,_31UL,_203UL,_613UL,_123UL,_Detail::M3<7>,_Detail::M1,_Detail::M3<12>,_Detail::M3<-10>,_Detail::M3<-19>,_Detail::M2<-11>,_Detail::M3<4>,_Detail::M3<-10>,_Detail::NoTempering>
::operator()(Well<unsigned_int,_32UL,_624UL,_31UL,_203UL,_613UL,_123UL,_Detail::M3<7>,_Detail::M1,_Detail::M3<12>,_Detail::M3<_10>,_Detail::M3<_19>,_Detail::M2<_11>,_Detail::M3<4>,_Detail::M3<_10>,_Detail::NoTempering>
             *this)

{
  uint uVar1;
  uint uVar2;
  size_t sVar3;
  uint uVar4;
  unsigned_long uVar5;
  unsigned_long uVar6;
  uint uVar7;
  uint uVar8;
  
  sVar3 = this->index_;
  uVar5 = Detail::Modulo<unsigned_long,_624UL>::calc<unsigned_long>(sVar3 + 0x26f);
  uVar6 = Detail::Modulo<unsigned_long,_624UL>::calc<unsigned_long>(sVar3 + 0x26e);
  uVar1 = this->state_[uVar5];
  uVar2 = this->state_[uVar6];
  uVar7 = this->state_[sVar3];
  uVar6 = Detail::Modulo<unsigned_long,_624UL>::calc<unsigned_long>(sVar3 + 0xcb);
  uVar7 = uVar7 >> 7 ^ this->state_[uVar6] ^ uVar7;
  uVar6 = Detail::Modulo<unsigned_long,_624UL>::calc<unsigned_long>(sVar3 + 0x265);
  uVar4 = this->state_[uVar6];
  uVar6 = Detail::Modulo<unsigned_long,_624UL>::calc<unsigned_long>(sVar3 + 0x7b);
  uVar8 = uVar4 ^ this->state_[uVar6] ^ this->state_[uVar6] << 10 ^ uVar4 >> 0xc;
  uVar4 = uVar8 ^ uVar7;
  this->state_[sVar3] = uVar4;
  uVar7 = uVar4 << 10 ^
          uVar8 >> 4 ^ uVar2 << 0x13 ^ (uVar2 & 0x7fffffff | uVar1 & 0x80000000) ^ uVar7 << 0xb ^
          uVar7;
  this->state_[uVar5] = uVar7;
  this->index_ = uVar5;
  return uVar7;
}

Assistant:

result_type operator()()
    {
        const UIntType upper_mask = ~0U << p;
        const UIntType lower_mask = ~upper_mask;

        // v[i,j] = state[(r-i+j) mod r]
        std::size_t i = index_;
        // Equivalent to r-i but allows to avoid negative values in the
        // following two expressions
        std::size_t j = i + r;
        std::size_t k = mod(j - 1); // [i,r-1]
        std::size_t l = mod(j - 2); // [i,r-2]

        std::size_t im1 = i + m1;
        std::size_t im2 = i + m2;
        std::size_t im3 = i + m3;

        UIntType z0, z1, z2, z3, z4;

        z0 = (state_[k] & upper_mask) | (state_[l] & lower_mask);
        z1 = T0::transform(state_[i]) ^
             T1::transform(state(im1));
        z2 = T2::transform(state(im2)) ^
             T3::transform(state(im3));
        z3 = z1 ^ z2;
        z4 = T4::transform(z0) ^ T5::transform(z1) ^
             T6::transform(z2) ^ T7::transform(z3);

        state_[i] = z3; // v[i+1,1]
        state_[k] = z4; // v[i+1,0]

        index_ = k;

        return Tempering::template apply<r>(z4, state_, im2);
    }